

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_draw.cpp
# Opt level: O0

void __thiscall
DCanvas::VirtualToRealCoords
          (DCanvas *this,double *x,double *y,double *w,double *h,double vwidth,double vheight,
          bool vbottom,bool handleaspect)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  float local_7c;
  double bottom;
  double right;
  float myratio;
  bool handleaspect_local;
  bool vbottom_local;
  double vheight_local;
  double vwidth_local;
  double *h_local;
  double *w_local;
  double *y_local;
  double *x_local;
  DCanvas *this_local;
  
  if (handleaspect) {
    local_7c = ActiveRatio(this->Width,this->Height,(float *)0x0);
  }
  else {
    local_7c = 1.3333334;
  }
  right._0_4_ = local_7c;
  if (1.7 < local_7c) {
    right._0_4_ = 1.7777778;
  }
  dVar1 = *x;
  dVar2 = *w;
  dVar3 = *y;
  dVar4 = *h;
  if (right._0_4_ <= 1.334) {
    *x = (*x * (double)this->Width) / vwidth;
    *w = ((dVar1 + dVar2) * (double)this->Width) / vwidth - *x;
  }
  else {
    dVar5 = *x;
    iVar6 = this->Width;
    iVar8 = AspectBaseWidth(right._0_4_);
    *x = ((dVar5 - vwidth * 0.5) * (double)iVar6 * 960.0) / (vwidth * (double)iVar8) +
         (double)this->Width * 0.5;
    iVar6 = this->Width;
    iVar8 = AspectBaseWidth(right._0_4_);
    *w = ((((dVar1 + dVar2) - vwidth * 0.5) * (double)iVar6 * 960.0) / (vwidth * (double)iVar8) +
         (double)this->Width * 0.5) - *x;
  }
  bVar7 = AspectTallerThanWide(right._0_4_);
  if (bVar7) {
    dVar1 = *y;
    iVar6 = this->Height;
    iVar8 = AspectBaseHeight(right._0_4_);
    *y = ((dVar1 - vheight * 0.5) * (double)iVar6 * 600.0) / (vheight * (double)iVar8) +
         (double)this->Height * 0.5;
    iVar6 = this->Height;
    iVar8 = AspectBaseHeight(right._0_4_);
    *h = ((((dVar3 + dVar4) - vheight * 0.5) * (double)iVar6 * 600.0) / (vheight * (double)iVar8) +
         (double)this->Height * 0.5) - *y;
    if (vbottom) {
      iVar6 = this->Height;
      iVar8 = this->Height;
      iVar9 = AspectMultiplier(right._0_4_);
      *y = ((double)iVar6 - (double)(iVar8 * iVar9) / 48.0) * 0.5 + *y;
    }
  }
  else {
    *y = (*y * (double)this->Height) / vheight;
    *h = ((dVar3 + dVar4) * (double)this->Height) / vheight - *y;
  }
  return;
}

Assistant:

void DCanvas::VirtualToRealCoords(double &x, double &y, double &w, double &h,
	double vwidth, double vheight, bool vbottom, bool handleaspect) const
{
	float myratio = handleaspect ? ActiveRatio (Width, Height) : (4.0f / 3.0f);

    // if 21:9 AR, map to 16:9 for all callers.
    // this allows for black bars and stops the stretching of fullscreen images
    if (myratio > 1.7f) {
        myratio = 16.0f / 9.0f;
    }

	double right = x + w;
	double bottom = y + h;

	if (myratio > 1.334f)
	{ // The target surface is either 16:9 or 16:10, so expand the
	  // specified virtual size to avoid undesired stretching of the
	  // image. Does not handle non-4:3 virtual sizes. I'll worry about
	  // those if somebody expresses a desire to use them.
		x = (x - vwidth * 0.5) * Width * 960 / (vwidth * AspectBaseWidth(myratio)) + Width * 0.5;
		w = (right - vwidth * 0.5) * Width * 960 / (vwidth * AspectBaseWidth(myratio)) + Width * 0.5 - x;
	}
	else
	{
		x = x * Width / vwidth;
		w = right * Width / vwidth - x;
	}
	if (AspectTallerThanWide(myratio))
	{ // The target surface is 5:4
		y = (y - vheight * 0.5) * Height * 600 / (vheight * AspectBaseHeight(myratio)) + Height * 0.5;
		h = (bottom - vheight * 0.5) * Height * 600 / (vheight * AspectBaseHeight(myratio)) + Height * 0.5 - y;
		if (vbottom)
		{
			y += (Height - Height * AspectMultiplier(myratio) / 48.0) * 0.5;
		}
	}
	else
	{
		y = y * Height / vheight;
		h = bottom * Height / vheight - y;
	}
}